

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrect.cpp
# Opt level: O1

QRect __thiscall QRectF::toAlignedRect(QRectF *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  QRect QVar5;
  
  dVar2 = this->xp;
  dVar4 = this->yp;
  dVar1 = floor(dVar2);
  dVar2 = ceil(dVar2 + this->w);
  dVar3 = floor(dVar4);
  dVar4 = ceil(dVar4 + this->h);
  QVar5.y1.m_i = (int)dVar3;
  QVar5.x1.m_i = (int)dVar1;
  QVar5.y2.m_i = (int)dVar4 + -1;
  QVar5.x2.m_i = (int)dVar2 + -1;
  return QVar5;
}

Assistant:

QRect QRectF::toAlignedRect() const noexcept
{
    int xmin = qFloor(xp);
    int xmax = qCeil(xp + w);
    int ymin = qFloor(yp);
    int ymax = qCeil(yp + h);
    return QRect(xmin, ymin, xmax - xmin, ymax - ymin);
}